

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void canvas_obj(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  int iVar2;
  t_symbol *sel;
  _glist *p_Var3;
  _undo *p_Var4;
  _glist *x_00;
  void *data;
  t_float tVar5;
  t_float tVar6;
  int local_54;
  int local_50;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  _binbuf *b_1;
  _binbuf *b;
  t_text *x;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  _glist *gl_local;
  
  x = (t_text *)argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)gl;
  if (argc < 2) {
    iVar2 = glist_isvisible(gl);
    if (iVar2 == 0) {
      post("unable to create stub object in closed canvas!");
    }
    else {
      _xpix = binbuf_new();
      canvas_howputnew((_glist *)s_local,&ypix,&indx,&nobj,&local_50,&local_54);
      ptVar1 = s_local;
      sel = gensym("editmode");
      pd_vmess((t_pd *)ptVar1,sel,"i");
      canvas_objtext((_glist *)s_local,indx,nobj,0,1,_xpix);
      if (ypix == 0) {
        p_Var3 = glist_getcanvas((_glist *)s_local);
        canvas_startmotion(p_Var3);
      }
      else {
        canvas_connect((_glist *)s_local,(float)local_50,0.0,(float)local_54,0.0);
      }
      p_Var3 = glist_getcanvas((_glist *)s_local);
      p_Var4 = canvas_undo_get(p_Var3);
      if (p_Var4->u_doing == 0) {
        p_Var3 = glist_getcanvas((_glist *)s_local);
        x_00 = glist_getcanvas((_glist *)s_local);
        data = canvas_undo_set_create(x_00);
        canvas_undo_add(p_Var3,UNDO_CREATE,"create",data);
      }
    }
  }
  else {
    b_1 = binbuf_new();
    binbuf_restore(b_1,argv_local._4_4_ + -2,(t_atom *)&x->te_inlet);
    ptVar1 = s_local;
    tVar5 = atom_getfloatarg(0,argv_local._4_4_,(t_atom *)x);
    tVar6 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
    canvas_objtext((_glist *)ptVar1,(int)tVar5,(int)tVar6,0,0,b_1);
  }
  return;
}

Assistant:

void canvas_obj(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_text *x;
    if (argc >= 2)
    {
        t_binbuf *b = binbuf_new();
        binbuf_restore(b, argc-2, argv+2);
        canvas_objtext(gl, atom_getfloatarg(0, argc, argv),
            atom_getfloatarg(1, argc, argv), 0, 0, b);
    }
        /* JMZ: don't go into interactive mode in a closed canvas */
    else if (!glist_isvisible(gl))
        post("unable to create stub object in closed canvas!");
    else
    {
            /* interactively create new object */
        t_binbuf *b = binbuf_new();
        int connectme, xpix, ypix, indx, nobj;
        canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);
        pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);
        canvas_objtext(gl, xpix, ypix, 0, 1, b);
        if (connectme)
            canvas_connect(gl, indx, 0, nobj, 0);
        else canvas_startmotion(glist_getcanvas(gl));
        if (!canvas_undo_get(glist_getcanvas(gl))->u_doing)
            canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(glist_getcanvas(gl)));
    }
}